

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_1b5905c::CheckLinkLibraryPattern
          (anon_unknown_dwarf_1b5905c *this,string_view property,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *value,cmake *context)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  bool bVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  cmake *local_e8;
  string local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  anon_unknown_dwarf_1b5905c *local_b0;
  size_t local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  undefined1 *local_88;
  undefined8 local_80;
  char *local_78;
  anon_unknown_dwarf_1b5905c *local_70;
  size_t local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  char *local_38;
  
  local_e8 = (cmake *)value;
  if (((anonymous_namespace)::
       CheckLinkLibraryPattern(std::basic_string_view<char,std::char_traits<char>>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>const&,cmake*)
       ::linkPattern == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   CheckLinkLibraryPattern(std::basic_string_view<char,std::char_traits<char>>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>const&,cmake*)
                                   ::linkPattern), iVar3 != 0)) {
    CheckLinkLibraryPattern::linkPattern.regmust = (char *)0x0;
    CheckLinkLibraryPattern::linkPattern.program = (char *)0x0;
    CheckLinkLibraryPattern::linkPattern.progsize = 0;
    memset(&CheckLinkLibraryPattern::linkPattern,0,0xaa);
    cmsys::RegularExpression::compile
              (&CheckLinkLibraryPattern::linkPattern,"(^|;)(</?LINK_(LIBRARY|GROUP):[^;>]*>)(;|$)");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&CheckLinkLibraryPattern::linkPattern,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         CheckLinkLibraryPattern(std::basic_string_view<char,std::char_traits<char>>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>const&,cmake*)
                         ::linkPattern);
  }
  puVar1 = *(undefined8 **)(property._M_str + 8);
  bVar5 = true;
  for (puVar4 = *(undefined8 **)property._M_str; puVar4 != puVar1; puVar4 = puVar4 + 6) {
    bVar2 = cmsys::RegularExpression::find
                      (&CheckLinkLibraryPattern::linkPattern,(char *)*puVar4,
                       &CheckLinkLibraryPattern::linkPattern.regmatch);
    if (bVar2) {
      if (CheckLinkLibraryPattern::linkPattern.regmatch.startp[2] == (char *)0x0) {
        local_108 = &local_f8;
        local_100 = 0;
        local_f8 = 0;
      }
      else {
        local_108 = &local_f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,CheckLinkLibraryPattern::linkPattern.regmatch.startp[2],
                   CheckLinkLibraryPattern::linkPattern.regmatch.endp[2]);
      }
      if (CheckLinkLibraryPattern::linkPattern.regmatch.startp[3] == (char *)0x0) {
        local_128 = &local_118;
        local_120 = 0;
        local_118 = 0;
      }
      else {
        local_128 = &local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,CheckLinkLibraryPattern::linkPattern.regmatch.startp[3],
                   CheckLinkLibraryPattern::linkPattern.regmatch.endp[3]);
      }
      local_c0._M_len = 9;
      local_c0._M_str = "Property ";
      local_a0 = 0x1c;
      local_98 = " contains the invalid item \"";
      local_90 = local_100;
      local_88 = local_108;
      local_80 = 7;
      local_78 = "\". The ";
      local_60 = 0x37;
      local_58 = " property may contain the generator-expression \"$<LINK_";
      local_50 = local_120;
      local_48 = local_128;
      local_40 = 0x41;
      local_38 = ":...>\" which may be used to specify how the libraries are linked.";
      views._M_len = 9;
      views._M_array = &local_c0;
      local_b0 = this;
      local_a8 = property._M_len;
      local_70 = this;
      local_68 = property._M_len;
      cmCatViews_abi_cxx11_(&local_e0,views);
      cmake::IssueMessage(local_e8,FATAL_ERROR,&local_e0,(cmListFileBacktrace *)(puVar4 + 4));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
      }
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool CheckLinkLibraryPattern(cm::string_view property,
                             const std::vector<BT<std::string>>& value,
                             cmake* context)
{
  // Look for <LINK_LIBRARY:> and </LINK_LIBRARY:> internal tags
  static cmsys::RegularExpression linkPattern(
    "(^|;)(</?LINK_(LIBRARY|GROUP):[^;>]*>)(;|$)");

  bool isValid = true;

  for (const auto& item : value) {
    if (!linkPattern.find(item.Value)) {
      continue;
    }

    isValid = false;

    // Report an error.
    context->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Property ", property, " contains the invalid item \"",
        linkPattern.match(2), "\". The ", property,
        " property may contain the generator-expression \"$<LINK_",
        linkPattern.match(3),
        ":...>\" which may be used to specify how the libraries are linked."),
      item.Backtrace);
  }

  return isValid;
}